

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_info.cc
# Opt level: O0

void * v2i_AUTHORITY_INFO_ACCESS
                 (X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  bool bVar1;
  enable_if_t<_internal::StackTraits<stack_st_ACCESS_DESCRIPTION>::kIsConst,_bool> eVar2;
  stack_st_ACCESS_DESCRIPTION *__p;
  CONF_VALUE *pCVar3;
  ACCESS_DESCRIPTION *__p_00;
  char *pcVar4;
  pointer pAVar5;
  GENERAL_NAME *pGVar6;
  pointer pcVar7;
  ASN1_OBJECT *pAVar8;
  pointer sk;
  unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> local_80;
  unique_ptr<char,_bssl::internal::Deleter> local_78;
  UniquePtr<char> objtmp;
  CONF_VALUE ctmp;
  char *ptmp;
  UniquePtr<ACCESS_DESCRIPTION> acc;
  CONF_VALUE *cnf;
  size_t i;
  unique_ptr<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter> local_30;
  UniquePtr<AUTHORITY_INFO_ACCESS> ainfo;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  ainfo._M_t.super___uniq_ptr_impl<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_ACCESS_DESCRIPTION_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_ACCESS_DESCRIPTION_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter,_true,_true>)nval;
  __p = sk_ACCESS_DESCRIPTION_new_null();
  std::unique_ptr<stack_st_ACCESS_DESCRIPTION,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_ACCESS_DESCRIPTION,bssl::internal::Deleter> *)&local_30,__p);
  bVar1 = std::operator==(&local_30,(nullptr_t)0x0);
  if (bVar1) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    cnf = (CONF_VALUE *)0x0;
    while( true ) {
      pCVar3 = (CONF_VALUE *)
               sk_CONF_VALUE_num((stack_st_CONF_VALUE *)
                                 ainfo._M_t.
                                 super___uniq_ptr_impl<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_stack_st_ACCESS_DESCRIPTION_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_stack_st_ACCESS_DESCRIPTION_*,_false>.
                                 _M_head_impl);
      if (pCVar3 <= cnf) break;
      acc._M_t.super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter,_true,_true>)
           sk_CONF_VALUE_value((stack_st_CONF_VALUE *)
                               ainfo._M_t.
                               super___uniq_ptr_impl<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_stack_st_ACCESS_DESCRIPTION_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_stack_st_ACCESS_DESCRIPTION_*,_false>.
                               _M_head_impl,(size_t)cnf);
      __p_00 = ACCESS_DESCRIPTION_new();
      std::unique_ptr<ACCESS_DESCRIPTION_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ACCESS_DESCRIPTION_st,bssl::internal::Deleter> *)&ptmp,(pointer)__p_00)
      ;
      bVar1 = std::operator==((unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> *)&ptmp,
                              (nullptr_t)0x0);
      if (bVar1) {
        method_local = (X509V3_EXT_METHOD *)0x0;
        bVar1 = true;
      }
      else {
        pcVar4 = strchr(*(char **)((long)acc._M_t.
                                         super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>.
                                         _M_head_impl + 8),0x3b);
        if (pcVar4 == (char *)0x0) {
          ERR_put_error(0x14,0,0x87,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_info.cc"
                        ,0x89);
          method_local = (X509V3_EXT_METHOD *)0x0;
          bVar1 = true;
        }
        else {
          pAVar5 = std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::operator->
                             ((unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> *)&ptmp);
          pGVar6 = v2i_GENERAL_NAME_ex((GENERAL_NAME *)pAVar5->location,(X509V3_EXT_METHOD *)method,
                                       (X509V3_CTX *)ctx,(CONF_VALUE *)&objtmp,0);
          if (pGVar6 == (GENERAL_NAME *)0x0) {
            method_local = (X509V3_EXT_METHOD *)0x0;
            bVar1 = true;
          }
          else {
            pcVar4 = OPENSSL_strndup(*(char **)((long)acc._M_t.
                                                  super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>
                                                  .
                                                  super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>
                                                  ._M_head_impl + 8),
                                     (long)pcVar4 -
                                     *(long *)((long)acc._M_t.
                                                  super___uniq_ptr_impl<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ACCESS_DESCRIPTION_st_*,_bssl::internal::Deleter>
                                                  .
                                                  super__Head_base<0UL,_ACCESS_DESCRIPTION_st_*,_false>
                                                  ._M_head_impl + 8));
            std::unique_ptr<char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<char,bssl::internal::Deleter> *)&local_78,pcVar4);
            bVar1 = std::operator==(&local_78,(nullptr_t)0x0);
            if (bVar1) {
              method_local = (X509V3_EXT_METHOD *)0x0;
              bVar1 = true;
            }
            else {
              pcVar7 = std::unique_ptr<char,_bssl::internal::Deleter>::get(&local_78);
              pAVar8 = OBJ_txt2obj(pcVar7,0);
              pAVar5 = std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> *)
                                  &ptmp);
              pAVar5->method = (ASN1_OBJECT *)pAVar8;
              pAVar5 = std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> *)
                                  &ptmp);
              if (pAVar5->method == (ASN1_OBJECT *)0x0) {
                ERR_put_error(0x14,0,0x65,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_info.cc"
                              ,0x98);
                pcVar7 = std::unique_ptr<char,_bssl::internal::Deleter>::get(&local_78);
                ERR_add_error_data(2,"value=",pcVar7);
                method_local = (X509V3_EXT_METHOD *)0x0;
                bVar1 = true;
              }
              else {
                sk = std::unique_ptr<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>::get
                               (&local_30);
                std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::unique_ptr
                          (&local_80,
                           (unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> *)&ptmp);
                eVar2 = bssl::PushToStack<stack_st_ACCESS_DESCRIPTION>(sk,&local_80);
                std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::~unique_ptr
                          (&local_80);
                if (((eVar2 ^ 0xffU) & 1) == 0) {
                  bVar1 = false;
                }
                else {
                  method_local = (X509V3_EXT_METHOD *)0x0;
                  bVar1 = true;
                }
              }
            }
            std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&local_78);
          }
        }
      }
      std::unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ACCESS_DESCRIPTION_st,_bssl::internal::Deleter> *)&ptmp);
      if (bVar1) goto LAB_003178c0;
      cnf = (CONF_VALUE *)((long)&cnf->section + 1);
    }
    method_local = (X509V3_EXT_METHOD *)
                   std::unique_ptr<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>::release
                             (&local_30);
  }
LAB_003178c0:
  std::unique_ptr<stack_st_ACCESS_DESCRIPTION,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return method_local;
}

Assistant:

static void *v2i_AUTHORITY_INFO_ACCESS(const X509V3_EXT_METHOD *method,
                                       const X509V3_CTX *ctx,
                                       const STACK_OF(CONF_VALUE) *nval) {
  bssl::UniquePtr<AUTHORITY_INFO_ACCESS> ainfo(sk_ACCESS_DESCRIPTION_new_null());
  if (ainfo == nullptr) {
    return nullptr;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    bssl::UniquePtr<ACCESS_DESCRIPTION> acc(ACCESS_DESCRIPTION_new());
    if (acc == nullptr) {
      return nullptr;
    }
    char *ptmp = strchr(cnf->name, ';');
    if (!ptmp) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SYNTAX);
      return nullptr;
    }
    CONF_VALUE ctmp;
    ctmp.name = ptmp + 1;
    ctmp.value = cnf->value;
    if (!v2i_GENERAL_NAME_ex(acc->location, method, ctx, &ctmp, 0)) {
      return nullptr;
    }
    bssl::UniquePtr<char> objtmp(OPENSSL_strndup(cnf->name, ptmp - cnf->name));
    if (objtmp == nullptr) {
      return nullptr;
    }
    acc->method = OBJ_txt2obj(objtmp.get(), 0);
    if (!acc->method) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_BAD_OBJECT);
      ERR_add_error_data(2, "value=", objtmp.get());
      return nullptr;
    }
    if (!bssl::PushToStack(ainfo.get(), std::move(acc))) {
      return nullptr;
    }
  }
  return ainfo.release();
}